

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

void Gia_MuxStructPrint(Gia_Man_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  
  if ((p->pMuxes != (uint *)0x0) && (p->pMuxes[iObj] != 0)) {
    iVar1 = Gia_MuxDeref(p,iObj);
    Gia_MuxStructPrint_rec(p,iObj,1);
    iVar2 = Gia_MuxRef(p,iObj);
    if (iVar1 == iVar2) {
      putchar(10);
      return;
    }
    __assert_fail("Count1 == Count2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x19a,"void Gia_MuxStructPrint(Gia_Man_t *, int)");
  }
  __assert_fail("Gia_ObjIsMuxId(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                ,0x196,"void Gia_MuxStructPrint(Gia_Man_t *, int)");
}

Assistant:

void Gia_MuxStructPrint( Gia_Man_t * p, int iObj )
{
    int Count1, Count2;
    assert( Gia_ObjIsMuxId(p, iObj) );
    Count1 = Gia_MuxDeref( p, iObj );
    Gia_MuxStructPrint_rec( p, iObj, 1 );
    Count2 = Gia_MuxRef( p, iObj );
    assert( Count1 == Count2 );
    printf( "\n" );
}